

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O3

int ms5837_write_command(MS5837 *pMS5837,uint8_t cmd)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  uchar sendbuf [1];
  uint8_t local_129;
  uint8_t local_128 [264];
  
  iVar1 = (pMS5837->I2CBus).DevType;
  local_129 = cmd;
  if (iVar1 == 0) {
    sVar2 = write(*(int *)&(pMS5837->I2CBus).hDev,&local_129,1);
    if (0 < (int)sVar2) goto LAB_001bf067;
  }
  else if (iVar1 == 1) {
    local_128[0] = (uint8_t)(pMS5837->I2CBus).rw_mode;
    local_128[1] = (uint8_t)(pMS5837->I2CBus).i2c_addr;
    local_128[2] = 1;
    iVar1 = (pMS5837->I2CBus).RS232Port.DevType;
    local_128[3] = cmd;
    if (iVar1 - 1U < 4) {
      iVar1 = (pMS5837->I2CBus).RS232Port.s;
      uVar4 = 0;
      do {
        sVar2 = send(iVar1,local_128 + uVar4,(ulong)(4 - (int)uVar4),0);
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while ((int)uVar3 < 4);
    }
    else {
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = *(int *)&(pMS5837->I2CBus).RS232Port.hDev;
      uVar4 = 0;
      do {
        sVar2 = write(iVar1,local_128 + uVar4,(ulong)(4 - (int)uVar4));
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < 4);
    }
LAB_001bf067:
    if (pMS5837->bSaveRawData == 0) {
      return 0;
    }
    if ((FILE *)pMS5837->pfSaveFile != (FILE *)0x0) {
      fputc((int)(char)cmd,(FILE *)pMS5837->pfSaveFile);
      fflush((FILE *)pMS5837->pfSaveFile);
      return 0;
    }
    return 0;
  }
  return 1;
}

Assistant:

inline int ms5837_write_command(MS5837* pMS5837, uint8_t cmd)
{
	unsigned char sendbuf[1];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)cmd;
	sendbuflen = 1;

	if (WriteAllI2CBus(&pMS5837->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	return EXIT_SUCCESS;
}